

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::Compiler::analyze_variable_scope
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler)

{
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *__k;
  key_type kVar1;
  size_t sVar2;
  pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
  *ppVar3;
  undefined4 uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  iterator iVar10;
  SPIRBlock *pSVar11;
  __node_base_ptr p_Var12;
  TypedID<(diligent_spirv_cross::Types)2> *pTVar13;
  SPIRType *pSVar14;
  mapped_type *pmVar15;
  const_iterator cVar16;
  SPIRVariable *pSVar17;
  iterator iVar18;
  const_iterator cVar19;
  mapped_type *pmVar20;
  ulong uVar21;
  const_iterator cVar22;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var23;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var24;
  _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  uint uVar25;
  _Prime_rehash_policy *p_Var26;
  SPIRFunction *pSVar27;
  long lVar28;
  _Hash_node_base *p_Var29;
  TypedID<(diligent_spirv_cross::Types)6> *block_id;
  TypedID<(diligent_spirv_cross::Types)6> *__k_00;
  _Hash_node_base *p_Var30;
  __node_base _Var31;
  bool bVar32;
  bool static_loop_init;
  uint32_t dominating_block;
  __hashtable *__h;
  __hashtable *__h_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_blocks;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *__range1;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  potential_loop_variables;
  bool local_105;
  key_type local_104;
  _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_100;
  anon_class_16_2_2fc8764d local_f8;
  SPIRFunction *local_e8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_e0;
  SPIRFunction *local_d8;
  CFG *local_d0;
  AnalyzeVariableScopeAccessHandler *local_c8;
  SPIRBlock *local_c0;
  undefined1 local_b8 [56];
  _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_80;
  _Hash_node_base *local_78;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  traverse_all_reachable_opcodes(this,entry,&handler->super_OpcodeHandler);
  local_68._M_buckets =
       (__buckets_ptr)CONCAT44(local_68._M_buckets._4_4_,(entry->super_IVariant).self.id);
  iVar10 = ::std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->function_cfgs)._M_h,(key_type_conflict *)&local_68);
  local_d0 = *(CFG **)((long)iVar10.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false>
                             ._M_cur + 0x10);
  local_70 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&handler->accessed_variables_to_block;
  local_c8 = handler;
  analyze_parameter_preservation
            (this,entry,local_d0,
             (unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)local_70,&handler->complete_write_variables_to_block);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  sVar2 = (entry->blocks).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.
          buffer_size;
  local_d8 = entry;
  if (sVar2 != 0) {
    __k_00 = (entry->blocks).
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.ptr;
    lVar28 = sVar2 << 2;
    do {
      pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                          ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                           __k_00->id);
      p_Var12 = ::std::
                _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_find_before_node
                          (&(this->ir).continue_block_to_loop_header._M_h,
                           (ulong)__k_00->id %
                           (this->ir).continue_block_to_loop_header._M_h._M_bucket_count,__k_00,
                           (ulong)__k_00->id);
      if (p_Var12 == (__node_base_ptr)0x0) {
        uVar6 = __k_00->id;
LAB_007ae087:
        uVar7 = CFG::find_loop_dominator(local_d0,uVar6);
        if (uVar7 != __k_00->id) goto LAB_007ae0a4;
        (pSVar11->loop_dominator).id = 0xffffffff;
      }
      else {
        uVar6 = __k_00->id;
        if ((p_Var12->_M_nxt == (_Hash_node_base *)0x0) ||
           (uVar7 = *(uint32_t *)((long)&p_Var12->_M_nxt[1]._M_nxt + 4), uVar7 == uVar6))
        goto LAB_007ae087;
LAB_007ae0a4:
        (pSVar11->loop_dominator).id = uVar7;
      }
      __k_00 = __k_00 + 1;
      lVar28 = lVar28 + -4;
    } while (lVar28 != 0);
  }
  p_Var23 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(local_c8->accessed_variables_to_block)._M_h._M_before_begin._M_nxt;
  if (p_Var23 !=
      (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    local_c0 = (SPIRBlock *)&local_d0->visit_order;
    pSVar27 = local_d8;
    do {
      pTVar13 = (pSVar27->local_variables).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr
      ;
      local_b8._0_4_ = (int)p_Var23->_M_bucket_count;
      local_e0 = p_Var23;
      pTVar13 = ::std::
                __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>const>>
                          (pTVar13,pTVar13 + (pSVar27->local_variables).
                                             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                             .buffer_size,(DominatorBuilder *)local_b8);
      if (pTVar13 !=
          (pSVar27->local_variables).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr +
          (pSVar27->local_variables).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
          buffer_size) {
        DominatorBuilder::DominatorBuilder((DominatorBuilder *)local_b8,local_d0);
        p_Var23 = local_e0;
        local_e8 = (SPIRFunction *)&local_e0->_M_bucket_count;
        uVar6 = expression_type_id(this,(uint32_t)*(size_t *)local_e8);
        pSVar14 = Variant::get<diligent_spirv_cross::SPIRType>
                            ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             uVar6);
        p_Var26 = &p_Var23->_M_rehash_policy;
        uVar6 = 0;
        while (p_Var26 = *(_Prime_rehash_policy **)p_Var26, p_Var26 != (_Prime_rehash_policy *)0x0)
        {
          uVar25 = (uint)p_Var26->_M_next_resize;
          if (((this->ir).block_meta.super_VectorView<unsigned_char>.ptr[uVar25] & 2) != 0) {
            local_f8.blocks = (mapped_type *)CONCAT44(local_f8.blocks._4_4_,uVar25);
            pmVar15 = ::std::__detail::
                      _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&(this->ir).continue_block_to_loop_header,
                                   (key_type *)&local_f8);
            DominatorBuilder::add_block((DominatorBuilder *)local_b8,pmVar15->id);
            if ((((pSVar14->vecsize == 1) && (pSVar14->columns == 1)) &&
                (pSVar14->basetype != Struct)) &&
               ((pSVar14->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
              uVar25 = (uint)p_Var26->_M_next_resize;
              uVar6 = -(uint)(uVar6 != 0) | uVar25;
            }
            else {
              uVar25 = (uint)p_Var26->_M_next_resize;
            }
          }
          DominatorBuilder::add_block((DominatorBuilder *)local_b8,uVar25);
        }
        DominatorBuilder::lift_continue_block_dominator((DominatorBuilder *)local_b8);
        pSVar27 = local_d8;
        local_100 = (_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)(local_b8._8_8_ & 0xffffffff);
        if (local_100 ==
            (_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)0x0) {
          if (1 < uVar6 + 1) goto LAB_007ae2b9;
        }
        else {
          if (uVar6 + 1 < 2) goto LAB_007ae2d9;
          pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                               (long)local_100);
          if (pSVar11->merge != MergeLoop) {
            uVar21 = (ulong)(pSVar11->loop_dominator).id;
            if (uVar21 == 0xffffffff) goto LAB_007ae2b9;
            pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr
                                 + uVar21);
          }
          uVar7 = (pSVar11->merge_block).id;
          if (uVar7 == 0) {
LAB_007ae2b9:
            pmVar20 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&local_68,(key_type *)local_e8);
            *pmVar20 = uVar6;
            if ((uint)local_100 == 0) goto LAB_007ae3ee;
          }
          else {
            local_f8.blocks = (mapped_type *)CONCAT44(local_f8.blocks._4_4_,uVar7);
            cVar16 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_c0,(key_type_conflict *)&local_f8);
            if (cVar16.
                super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_false>
                ._M_cur == (__node_type *)0x0) goto LAB_007ae2b9;
            local_f8.blocks = (mapped_type *)CONCAT44(local_f8.blocks._4_4_,uVar6);
            cVar16 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_c0,(key_type_conflict *)&local_f8);
            if (cVar16.
                super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_false>
                ._M_cur != (__node_type *)0x0) {
              uVar7 = CFG::get_visit_order(local_d0,uVar7);
              uVar8 = CFG::get_visit_order(local_d0,uVar6);
              if (uVar7 <= uVar8) goto LAB_007ae2b9;
            }
          }
LAB_007ae2d9:
          pSVar17 = Variant::get<diligent_spirv_cross::SPIRVariable>
                              ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                               *(uint *)&((_Hashtable *)&local_e8->super_IVariant)->_M_buckets);
          if (pSVar17->phi_variable == false) {
            pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr
                                 + (long)local_100);
            bVar5 = may_read_undefined_variable_in_block
                              (this,pSVar11,
                               *(uint32_t *)&((_Hashtable *)&local_e8->super_IVariant)->_M_buckets);
            if (bVar5) {
              while (uVar21 = (ulong)(pSVar11->loop_dominator).id, uVar21 != 0xffffffff) {
                pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                    ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                                     ptr + uVar21);
              }
              uVar6 = (pSVar11->super_IVariant).self.id;
              if (uVar6 != (uint32_t)local_100) {
                DominatorBuilder::add_block((DominatorBuilder *)local_b8,uVar6);
                local_100 = (_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(local_b8._8_8_ & 0xffffffff);
              }
              if ((int)local_100 == 0) goto LAB_007ae3ee;
            }
          }
          pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                               ((ulong)local_100 & 0xffffffff));
          pSVar27 = local_e8;
          uVar6 = *(uint32_t *)&((_Hashtable *)&local_e8->super_IVariant)->_M_buckets;
          SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL>::reserve
                    (&pSVar11->dominated_variables,
                     (pSVar11->dominated_variables).
                     super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                     .buffer_size + 1);
          sVar2 = (pSVar11->dominated_variables).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
                  buffer_size;
          (pSVar11->dominated_variables).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr
          [sVar2].id = uVar6;
          (pSVar11->dominated_variables).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
          buffer_size = sVar2 + 1;
          pSVar17 = Variant::get<diligent_spirv_cross::SPIRVariable>
                              ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                               *(uint *)&((_Hashtable *)&pSVar27->super_IVariant)->_M_buckets);
          (pSVar17->dominator).id = (uint32_t)local_100;
          pSVar27 = local_d8;
        }
      }
LAB_007ae3ee:
      p_Var23 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((VectorView<unsigned_int> *)&local_e0->_M_buckets)->ptr;
    } while (p_Var23 !=
             (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)0x0);
  }
  p_Var30 = (local_c8->accessed_temporaries_to_block)._M_h._M_before_begin._M_nxt;
  if (p_Var30 != (_Hash_node_base *)0x0) {
    p_Var23 = &(local_c8->result_id_to_type)._M_h;
    this_00 = (_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&(this->ir).continue_block_to_loop_header;
    local_c8 = (AnalyzeVariableScopeAccessHandler *)&local_c8->access_chain_expressions;
    local_e8 = (SPIRFunction *)&this->hoisted_temporaries;
    local_d8 = (SPIRFunction *)&this->forced_temporaries;
    local_100 = this_00;
    local_e0 = p_Var23;
    do {
      __k = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)(p_Var30 + 1);
      iVar18 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(p_Var23,(key_type_conflict *)__k);
      if ((iVar18.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
           _M_cur != (__node_type *)0x0) &&
         ((pSVar14 = Variant::get<diligent_spirv_cross::SPIRType>
                               ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                *(uint *)((long)iVar18.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                                ._M_cur + 0xc)), pSVar14->pointer != false ||
          (pSVar14->basetype - AccelerationStructure < 0xfffffffd)))) {
        DominatorBuilder::DominatorBuilder((DominatorBuilder *)local_b8,local_d0);
        bVar5 = false;
        for (p_Var29 = p_Var30[4]._M_nxt; p_Var29 != (_Hash_node_base *)0x0;
            p_Var29 = p_Var29->_M_nxt) {
          DominatorBuilder::add_block((DominatorBuilder *)local_b8,*(uint32_t *)&p_Var29[1]._M_nxt);
          if ((p_Var30[5]._M_nxt != (_Hash_node_base *)0x1) &&
             (((this->ir).block_meta.super_VectorView<unsigned_char>.ptr
               [*(uint *)&p_Var29[1]._M_nxt] & 2) != 0)) {
            local_f8.blocks =
                 (mapped_type *)CONCAT44(local_f8.blocks._4_4_,*(uint *)&p_Var29[1]._M_nxt);
            pmVar15 = ::std::__detail::
                      _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](this_00,(key_type *)&local_f8);
            pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr
                                 + pmVar15->id);
            if (pSVar11->merge != MergeLoop) {
              __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                            ,0x1015,
                            "void diligent_spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                           );
            }
            bVar5 = true;
            DominatorBuilder::add_block
                      ((DominatorBuilder *)local_b8,(pSVar11->super_IVariant).self.id);
          }
        }
        uVar4 = local_b8._8_4_;
        local_104.id = local_b8._8_4_;
        if (p_Var30[5]._M_nxt == (_Hash_node_base *)0x1) {
          bVar32 = false;
        }
        else {
          pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                              ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                               (local_b8._8_8_ & 0xffffffff));
          bVar32 = uVar4 == (pSVar11->continue_block).id && pSVar11->merge == MergeLoop;
        }
        this_00 = local_100;
        p_Var23 = local_e0;
        if (local_104.id != 0) {
          cVar19 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)(p_Var30 + 2),&local_104.id);
          if ((bool)(~bVar32 &
                    cVar19.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0)) {
            this_00 = local_100;
            p_Var23 = local_e0;
            if ((_Hash_node_base *)0x1 < p_Var30[5]._M_nxt) {
              pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                  ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                                   ptr + local_104.id);
              pmVar20 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_e0,(key_type *)__k);
              SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_8UL>
              ::reserve(&pSVar11->potential_declare_temporary,
                        (pSVar11->potential_declare_temporary).
                        super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
                        .buffer_size + 1);
              ppVar3 = (pSVar11->potential_declare_temporary).
                       super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
                       .ptr;
              sVar2 = (pSVar11->potential_declare_temporary).
                      super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
                      .buffer_size;
              ppVar3[sVar2].first.id = *pmVar20;
              ppVar3[sVar2].second.id = *(uint32_t *)__k;
              (pSVar11->potential_declare_temporary).
              super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
              .buffer_size = sVar2 + 1;
              this_00 = local_100;
              p_Var23 = local_e0;
            }
          }
          else {
            cVar19 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_c8,(key_type_conflict *)__k);
            if (cVar19.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
            {
              local_f8.blocks = (mapped_type *)local_e8;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        (local_e8,__k,&local_f8);
              local_f8.blocks = (mapped_type *)local_d8;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        (local_d8,__k,&local_f8);
              pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                  ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                                   ptr + local_104.id);
              pmVar20 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_e0,(key_type *)__k);
              SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_8UL>
              ::reserve(&pSVar11->declare_temporary,
                        (pSVar11->declare_temporary).
                        super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
                        .buffer_size + 1);
              ppVar3 = (pSVar11->declare_temporary).
                       super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
                       .ptr;
              sVar2 = (pSVar11->declare_temporary).
                      super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
                      .buffer_size;
              ppVar3[sVar2].first.id = *pmVar20;
              ppVar3[sVar2].second.id = *(uint32_t *)__k;
              (pSVar11->declare_temporary).
              super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
              .buffer_size = sVar2 + 1;
              this_00 = local_100;
              p_Var23 = local_e0;
            }
            else {
              this_00 = local_100;
              p_Var23 = local_e0;
              if (bVar5) {
                pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                    ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                                     ptr + local_104.id);
                if (pSVar11->merge != MergeLoop) {
                  __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                                ,0x103d,
                                "void diligent_spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                               );
                }
                pSVar11->complex_continue = true;
                this_00 = local_100;
                p_Var23 = local_e0;
              }
            }
          }
        }
      }
      p_Var30 = p_Var30->_M_nxt;
    } while (p_Var30 != (_Hash_node_base *)0x0);
  }
  local_b8._0_8_ = local_b8 + 0x30;
  local_b8._8_8_ = 1;
  local_b8._16_8_ = (_Hash_node_base *)0x0;
  local_b8._24_8_ = 0;
  local_b8._32_4_ = 1.0;
  local_b8._40_8_ = 0;
  local_b8._48_8_ = (__node_base_ptr)0x0;
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    local_80 = &(this->ir).continue_block_to_loop_header._M_h;
    local_d8 = (SPIRFunction *)&local_d0->succeeding_edges;
    local_e0 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&local_d0->empty_vector;
    local_c8 = (AnalyzeVariableScopeAccessHandler *)&local_d0->preceding_edges;
    _Var31._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      pSVar17 = Variant::get<diligent_spirv_cross::SPIRVariable>
                          ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                           *(uint *)&_Var31._M_nxt[1]._M_nxt);
      uVar25 = (pSVar17->dominator).id;
      local_104.id = *(uint *)((long)&_Var31._M_nxt[1]._M_nxt + 4);
      if ((local_104.id + 1 < 2) || (uVar25 == 0)) goto LAB_007ae9fe;
      p_Var12 = ::std::
                _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_find_before_node
                          (local_80,(ulong)local_104.id %
                                    (this->ir).continue_block_to_loop_header._M_h._M_bucket_count,
                           &local_104,(ulong)local_104.id);
      if ((p_Var12 == (__node_base_ptr)0x0) || (p_Var12->_M_nxt == (_Hash_node_base *)0x0)) {
        pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                            ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             local_104.id);
        uVar9 = (pSVar11->continue_block).id;
        if (uVar9 != local_104.id) goto LAB_007aea52;
      }
      else {
        uVar9 = *(uint *)((long)&p_Var12->_M_nxt[1]._M_nxt + 4);
      }
      if (uVar9 == 0) {
LAB_007aea52:
        __assert_fail("header",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                      ,0x107b,
                      "void diligent_spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                     );
      }
      local_100 = (_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)CONCAT44(local_100._4_4_,uVar9);
      local_c0 = Variant::get<diligent_spirv_cross::SPIRBlock>
                           ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                            uVar9);
      local_e8 = (SPIRFunction *)
                 ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_70,(key_type *)(_Var31._M_nxt + 1));
      uVar9 = (uint)local_100;
      local_f8.blocks = (mapped_type *)CONCAT44(local_f8.blocks._4_4_,(uint)local_100);
      local_78 = _Var31._M_nxt + 1;
      cVar19 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_e8,(key_type_conflict *)&local_f8);
      bVar5 = cVar19.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0;
      local_105 = true;
      if (uVar25 == uVar9) {
        p_Var30 = (_Hash_node_base *)local_b8._16_8_;
        if (cVar19.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
joined_r0x007ae866:
          while (p_Var30 != (_Hash_node_base *)0x0) {
            p_Var29 = p_Var30->_M_nxt;
            operator_delete(p_Var30);
            p_Var30 = p_Var29;
          }
          memset((void *)local_b8._0_8_,0,local_b8._8_8_ << 3);
          local_b8._16_8_ = (_Hash_node_base *)0x0;
          local_b8._24_8_ = 0;
          local_f8.blocks = (mapped_type *)local_e8;
          local_f8.static_loop_init = &local_105;
          CFG::
          walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                    (local_d0,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_b8,(local_c0->merge_block).id,&local_f8);
          p_Var30 = local_78;
          pSVar11 = local_c0;
          if (local_105 != false) {
            kVar1 = *(key_type *)&local_78->_M_nxt;
            SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL>::reserve
                      (&local_c0->loop_variables,
                       (local_c0->loop_variables).
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                       .buffer_size + 1);
            pTVar13 = (pSVar11->loop_variables).
                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                      .ptr;
            sVar2 = (pSVar11->loop_variables).
                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                    .buffer_size;
            pTVar13[sVar2].id = kVar1;
            uVar21 = sVar2 + 1;
            (pSVar11->loop_variables).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
            buffer_size = uVar21;
            if (uVar21 != 0) {
              lVar28 = 0x3f;
              if (uVar21 != 0) {
                for (; uVar21 >> lVar28 == 0; lVar28 = lVar28 + -1) {
                }
              }
              ::std::
              __introsort_loop<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pTVar13,pTVar13 + uVar21,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
              ::std::
              __final_insertion_sort<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_less_iter>
                        (pTVar13,pTVar13 + uVar21);
            }
            pSVar17 = Variant::get<diligent_spirv_cross::SPIRVariable>
                                ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr
                                 + *(uint *)&p_Var30->_M_nxt);
            pSVar17->loop_variable = true;
          }
        }
      }
      else {
        do {
          local_f8.blocks._0_4_ = uVar25;
          cVar19 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_e8,(key_type_conflict *)&local_f8);
          local_f8.blocks = (mapped_type *)CONCAT44(local_f8.blocks._4_4_,uVar25);
          cVar22 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_d8,(key_type_conflict *)&local_f8);
          p_Var23 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)((long)cVar22.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                              ._M_cur + 0x10);
          if (cVar22.
              super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            p_Var23 = local_e0;
          }
          if (p_Var23->_M_bucket_count != 1) goto LAB_007ae9fe;
          local_f8.blocks =
               (mapped_type *)
               CONCAT44(local_f8.blocks._4_4_,
                        *((VectorView<unsigned_int> *)&p_Var23->_M_buckets)->ptr);
          cVar22 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_c8,(key_type_conflict *)&local_f8);
          p_Var24 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)((long)cVar22.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                              ._M_cur + 0x10);
          if (cVar22.
              super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            p_Var24 = local_e0;
          }
          if ((p_Var24->_M_bucket_count != 1) ||
             (*((VectorView<unsigned_int> *)&p_Var24->_M_buckets)->ptr != uVar25))
          goto LAB_007ae9fe;
          bVar5 = (bool)(bVar5 | cVar19.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                                 (__node_type *)0x0);
          uVar25 = *((VectorView<unsigned_int> *)&p_Var23->_M_buckets)->ptr;
        } while (uVar25 != (uint)local_100);
        p_Var30 = (_Hash_node_base *)local_b8._16_8_;
        if ((bVar5 & local_105) != 0) goto joined_r0x007ae866;
      }
LAB_007ae9fe:
      _Var31._M_nxt = (_Var31._M_nxt)->_M_nxt;
    } while (_Var31._M_nxt != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_b8);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void Compiler::analyze_variable_scope(SPIRFunction &entry, AnalyzeVariableScopeAccessHandler &handler)
{
	// First, we map out all variable access within a function.
	// Essentially a map of block -> { variables accessed in the basic block }
	traverse_all_reachable_opcodes(entry, handler);

	auto &cfg = *function_cfgs.find(entry.self)->second;

	// Analyze if there are parameters which need to be implicitly preserved with an "in" qualifier.
	analyze_parameter_preservation(entry, cfg, handler.accessed_variables_to_block,
	                               handler.complete_write_variables_to_block);

	unordered_map<uint32_t, uint32_t> potential_loop_variables;

	// Find the loop dominator block for each block.
	for (auto &block_id : entry.blocks)
	{
		auto &block = get<SPIRBlock>(block_id);

		auto itr = ir.continue_block_to_loop_header.find(block_id);
		if (itr != end(ir.continue_block_to_loop_header) && itr->second != block_id)
		{
			// Continue block might be unreachable in the CFG, but we still like to know the loop dominator.
			// Edge case is when continue block is also the loop header, don't set the dominator in this case.
			block.loop_dominator = itr->second;
		}
		else
		{
			uint32_t loop_dominator = cfg.find_loop_dominator(block_id);
			if (loop_dominator != block_id)
				block.loop_dominator = loop_dominator;
			else
				block.loop_dominator = SPIRBlock::NoDominator;
		}
	}

	// For each variable which is statically accessed.
	for (auto &var : handler.accessed_variables_to_block)
	{
		// Only deal with variables which are considered local variables in this function.
		if (find(begin(entry.local_variables), end(entry.local_variables), VariableID(var.first)) ==
		    end(entry.local_variables))
			continue;

		DominatorBuilder builder(cfg);
		auto &blocks = var.second;
		auto &type = expression_type(var.first);
		BlockID potential_continue_block = 0;

		// Figure out which block is dominating all accesses of those variables.
		for (auto &block : blocks)
		{
			// If we're accessing a variable inside a continue block, this variable might be a loop variable.
			// We can only use loop variables with scalars, as we cannot track static expressions for vectors.
			if (is_continue(block))
			{
				// Potentially awkward case to check for.
				// We might have a variable inside a loop, which is touched by the continue block,
				// but is not actually a loop variable.
				// The continue block is dominated by the inner part of the loop, which does not make sense in high-level
				// language output because it will be declared before the body,
				// so we will have to lift the dominator up to the relevant loop header instead.
				builder.add_block(ir.continue_block_to_loop_header[block]);

				// Arrays or structs cannot be loop variables.
				if (type.vecsize == 1 && type.columns == 1 && type.basetype != SPIRType::Struct && type.array.empty())
				{
					// The variable is used in multiple continue blocks, this is not a loop
					// candidate, signal that by setting block to -1u.
					if (potential_continue_block == 0)
						potential_continue_block = block;
					else
						potential_continue_block = ~(0u);
				}
			}

			builder.add_block(block);
		}

		builder.lift_continue_block_dominator();

		// Add it to a per-block list of variables.
		BlockID dominating_block = builder.get_dominator();

		if (dominating_block && potential_continue_block != 0 && potential_continue_block != ~0u)
		{
			auto &inner_block = get<SPIRBlock>(dominating_block);

			BlockID merge_candidate = 0;

			// Analyze the dominator. If it lives in a different loop scope than the candidate continue
			// block, reject the loop variable candidate.
			if (inner_block.merge == SPIRBlock::MergeLoop)
				merge_candidate = inner_block.merge_block;
			else if (inner_block.loop_dominator != SPIRBlock::NoDominator)
				merge_candidate = get<SPIRBlock>(inner_block.loop_dominator).merge_block;

			if (merge_candidate != 0 && cfg.is_reachable(merge_candidate))
			{
				// If the merge block has a higher post-visit order, we know that continue candidate
				// cannot reach the merge block, and we have two separate scopes.
				if (!cfg.is_reachable(potential_continue_block) ||
				    cfg.get_visit_order(merge_candidate) > cfg.get_visit_order(potential_continue_block))
				{
					potential_continue_block = 0;
				}
			}
		}

		if (potential_continue_block != 0 && potential_continue_block != ~0u)
			potential_loop_variables[var.first] = potential_continue_block;

		// For variables whose dominating block is inside a loop, there is a risk that these variables
		// actually need to be preserved across loop iterations. We can express this by adding
		// a "read" access to the loop header.
		// In the dominating block, we must see an OpStore or equivalent as the first access of an OpVariable.
		// Should that fail, we look for the outermost loop header and tack on an access there.
		// Phi nodes cannot have this problem.
		if (dominating_block)
		{
			auto &variable = get<SPIRVariable>(var.first);
			if (!variable.phi_variable)
			{
				auto *block = &get<SPIRBlock>(dominating_block);
				bool preserve = may_read_undefined_variable_in_block(*block, var.first);
				if (preserve)
				{
					// Find the outermost loop scope.
					while (block->loop_dominator != BlockID(SPIRBlock::NoDominator))
						block = &get<SPIRBlock>(block->loop_dominator);

					if (block->self != dominating_block)
					{
						builder.add_block(block->self);
						dominating_block = builder.get_dominator();
					}
				}
			}
		}

		// If all blocks here are dead code, this will be 0, so the variable in question
		// will be completely eliminated.
		if (dominating_block)
		{
			auto &block = get<SPIRBlock>(dominating_block);
			block.dominated_variables.push_back(var.first);
			get<SPIRVariable>(var.first).dominator = dominating_block;
		}
	}

	for (auto &var : handler.accessed_temporaries_to_block)
	{
		auto itr = handler.result_id_to_type.find(var.first);

		if (itr == end(handler.result_id_to_type))
		{
			// We found a false positive ID being used, ignore.
			// This should probably be an assert.
			continue;
		}

		// There is no point in doing domination analysis for opaque types.
		auto &type = get<SPIRType>(itr->second);
		if (type_is_opaque_value(type))
			continue;

		DominatorBuilder builder(cfg);
		bool force_temporary = false;
		bool used_in_header_hoisted_continue_block = false;

		// Figure out which block is dominating all accesses of those temporaries.
		auto &blocks = var.second;
		for (auto &block : blocks)
		{
			builder.add_block(block);

			if (blocks.size() != 1 && is_continue(block))
			{
				// The risk here is that inner loop can dominate the continue block.
				// Any temporary we access in the continue block must be declared before the loop.
				// This is moot for complex loops however.
				auto &loop_header_block = get<SPIRBlock>(ir.continue_block_to_loop_header[block]);
				assert(loop_header_block.merge == SPIRBlock::MergeLoop);
				builder.add_block(loop_header_block.self);
				used_in_header_hoisted_continue_block = true;
			}
		}

		uint32_t dominating_block = builder.get_dominator();

		if (blocks.size() != 1 && is_single_block_loop(dominating_block))
		{
			// Awkward case, because the loop header is also the continue block,
			// so hoisting to loop header does not help.
			force_temporary = true;
		}

		if (dominating_block)
		{
			// If we touch a variable in the dominating block, this is the expected setup.
			// SPIR-V normally mandates this, but we have extra cases for temporary use inside loops.
			bool first_use_is_dominator = blocks.count(dominating_block) != 0;

			if (!first_use_is_dominator || force_temporary)
			{
				if (handler.access_chain_expressions.count(var.first))
				{
					// Exceptionally rare case.
					// We cannot declare temporaries of access chains (except on MSL perhaps with pointers).
					// Rather than do that, we force the indexing expressions to be declared in the right scope by
					// tracking their usage to that end. There is no temporary to hoist.
					// However, we still need to observe declaration order of the access chain.

					if (used_in_header_hoisted_continue_block)
					{
						// For this scenario, we used an access chain inside a continue block where we also registered an access to header block.
						// This is a problem as we need to declare an access chain properly first with full definition.
						// We cannot use temporaries for these expressions,
						// so we must make sure the access chain is declared ahead of time.
						// Force a complex for loop to deal with this.
						// TODO: Out-of-order declaring for loops where continue blocks are emitted last might be another option.
						auto &loop_header_block = get<SPIRBlock>(dominating_block);
						assert(loop_header_block.merge == SPIRBlock::MergeLoop);
						loop_header_block.complex_continue = true;
					}
				}
				else
				{
					// This should be very rare, but if we try to declare a temporary inside a loop,
					// and that temporary is used outside the loop as well (spirv-opt inliner likes this)
					// we should actually emit the temporary outside the loop.
					hoisted_temporaries.insert(var.first);
					forced_temporaries.insert(var.first);

					auto &block_temporaries = get<SPIRBlock>(dominating_block).declare_temporary;
					block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
				}
			}
			else if (blocks.size() > 1)
			{
				// Keep track of the temporary as we might have to declare this temporary.
				// This can happen if the loop header dominates a temporary, but we have a complex fallback loop.
				// In this case, the header is actually inside the for (;;) {} block, and we have problems.
				// What we need to do is hoist the temporaries outside the for (;;) {} block in case the header block
				// declares the temporary.
				auto &block_temporaries = get<SPIRBlock>(dominating_block).potential_declare_temporary;
				block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
			}
		}
	}

	unordered_set<uint32_t> seen_blocks;

	// Now, try to analyze whether or not these variables are actually loop variables.
	for (auto &loop_variable : potential_loop_variables)
	{
		auto &var = get<SPIRVariable>(loop_variable.first);
		auto dominator = var.dominator;
		BlockID block = loop_variable.second;

		// The variable was accessed in multiple continue blocks, ignore.
		if (block == BlockID(~(0u)) || block == BlockID(0))
			continue;

		// Dead code.
		if (dominator == ID(0))
			continue;

		BlockID header = 0;

		// Find the loop header for this block if we are a continue block.
		{
			auto itr = ir.continue_block_to_loop_header.find(block);
			if (itr != end(ir.continue_block_to_loop_header))
			{
				header = itr->second;
			}
			else if (get<SPIRBlock>(block).continue_block == block)
			{
				// Also check for self-referential continue block.
				header = block;
			}
		}

		assert(header);
		auto &header_block = get<SPIRBlock>(header);
		auto &blocks = handler.accessed_variables_to_block[loop_variable.first];

		// If a loop variable is not used before the loop, it's probably not a loop variable.
		bool has_accessed_variable = blocks.count(header) != 0;

		// Now, there are two conditions we need to meet for the variable to be a loop variable.
		// 1. The dominating block must have a branch-free path to the loop header,
		// this way we statically know which expression should be part of the loop variable initializer.

		// Walk from the dominator, if there is one straight edge connecting
		// dominator and loop header, we statically know the loop initializer.
		bool static_loop_init = true;
		while (dominator != header)
		{
			if (blocks.count(dominator) != 0)
				has_accessed_variable = true;

			auto &succ = cfg.get_succeeding_edges(dominator);
			if (succ.size() != 1)
			{
				static_loop_init = false;
				break;
			}

			auto &pred = cfg.get_preceding_edges(succ.front());
			if (pred.size() != 1 || pred.front() != dominator)
			{
				static_loop_init = false;
				break;
			}

			dominator = succ.front();
		}

		if (!static_loop_init || !has_accessed_variable)
			continue;

		// The second condition we need to meet is that no access after the loop
		// merge can occur. Walk the CFG to see if we find anything.

		seen_blocks.clear();
		cfg.walk_from(seen_blocks, header_block.merge_block, [&](uint32_t walk_block) -> bool {
			// We found a block which accesses the variable outside the loop.
			if (blocks.find(walk_block) != end(blocks))
				static_loop_init = false;
			return true;
		});

		if (!static_loop_init)
			continue;

		// We have a loop variable.
		header_block.loop_variables.push_back(loop_variable.first);
		// Need to sort here as variables come from an unordered container, and pushing stuff in wrong order
		// will break reproducability in regression runs.
		sort(begin(header_block.loop_variables), end(header_block.loop_variables));
		get<SPIRVariable>(loop_variable.first).loop_variable = true;
	}
}